

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_str_kv_test.cc
# Opt level: O2

void kv_get_key_isnull_test(void)

{
  char *__format;
  size_t len;
  void *key;
  timeval __test_begin;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  key = (void *)0x0;
  btree_str_kv_get_key(&key,(void *)0x0,&len);
  if (len != 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
            ,0x70);
    kv_get_key_isnull_test()::__test_pass = '\x01';
    if (len != 0) {
      __assert_fail("len == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                    ,0x70,"void kv_get_key_isnull_test()");
    }
  }
  free(key);
  memleak_end();
  __format = "%s PASSED\n";
  if (kv_get_key_isnull_test()::__test_pass != '\0') {
    __format = "%s FAILED\n";
  }
  fprintf(_stderr,__format,"kv get key is null test");
  return;
}

Assistant:

void kv_get_key_isnull_test()
{

    TEST_INIT();
    memleak_start();

    void *key = NULL;
    char *strbuf = NULL;
    size_t len;
    btree_str_kv_get_key(&key, strbuf, &len);

    // check results
    TEST_CHK(len == 0);
    free(key);

    memleak_end();
    TEST_RESULT("kv get key is null test");
}